

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_thread_loop_filter_rows
               (YV12_BUFFER_CONFIG *frame_buffer,AV1_COMMON *cm,macroblockd_plane *planes,
               MACROBLOCKD *xd,int mi_row,int plane,int dir,int lpf_opt_level,AV1LfSync *lf_sync,
               aom_internal_error_info *error_info,AV1_DEBLOCKING_PARAMETERS *params_buf,
               TX_SIZE *tx_buf,int num_mis_in_lpf_unit_height_log2)

{
  int plane_start;
  YV12_BUFFER_CONFIG *in_RCX;
  undefined8 in_RDX;
  macroblockd_plane *in_RSI;
  int in_R8D;
  int in_R9D;
  uint32_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  int in_stack_00000008;
  uint in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  MACROBLOCKD *in_stack_00000018;
  AV1_COMMON *in_stack_00000020;
  _Bool lf_mt_exit;
  int num_planes;
  _Bool joint_filter_chroma;
  int c;
  int mi_col;
  int r;
  int sb_cols;
  undefined4 in_stack_0000008c;
  _Bool in_stack_000000c7;
  AV1_DEBLOCKING_PARAMETERS *in_stack_000000c8;
  uint32_t in_stack_000000d0;
  uint32_t in_stack_000000d4;
  MACROBLOCKD_PLANE *in_stack_000000d8;
  MACROBLOCKD *in_stack_000000e0;
  AV1_COMMON *in_stack_000000e8;
  TX_SIZE *in_stack_00000360;
  int in_stack_00000368;
  TX_SIZE *in_stack_000003f0;
  int in_stack_000003f8;
  int in_stack_00000408;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  bool local_4a;
  int local_3c;
  int iVar1;
  
  plane_start = *(int *)(in_RSI->seg_iqmatrix[2] + 7) + 0x1f >> 5;
  local_4a = in_stack_00000010 == 2 && 0 < in_R9D;
  if (in_stack_00000008 == 0) {
    for (local_3c = 0; local_3c < *(int *)(in_RSI->seg_iqmatrix[2] + 7); local_3c = local_3c + 0x20)
    {
      av1_setup_dst_planes
                (in_RSI,(BLOCK_SIZE)((ulong)in_RDX >> 0x38),in_RCX,in_R8D,in_R9D,plane_start,
                 in_stack_00000010);
      if (in_stack_00000010 == 0) {
        av1_filter_block_plane_vert
                  (in_stack_00000020,in_stack_00000018,in_stack_00000014,
                   (MACROBLOCKD_PLANE *)((ulong)in_stack_0000000c << 0x20),unaff_retaddr_00,
                   unaff_retaddr);
      }
      else if (in_R9D == 0) {
        in_stack_ffffffffffffff90 = c;
        av1_filter_block_plane_vert_opt
                  ((AV1_COMMON *)tx_buf,(MACROBLOCKD *)params_buf,(MACROBLOCKD_PLANE *)error_info,
                   lf_sync._4_4_,(uint32_t)lf_sync,
                   (AV1_DEBLOCKING_PARAMETERS *)CONCAT44(in_stack_0000008c,lpf_opt_level),
                   in_stack_00000360,in_stack_00000368);
      }
      else {
        in_stack_ffffffffffffff98 = (uint)local_4a;
        in_stack_ffffffffffffffa0 = c;
        iVar1 = in_R9D;
        av1_filter_block_plane_vert_opt_chroma
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
                   in_stack_000000d0,in_stack_000000c8,in_stack_000003f0,in_stack_000003f8,
                   in_stack_000000c7,in_stack_00000408);
        in_stack_ffffffffffffff90 = in_R9D;
        in_R9D = iVar1;
      }
      if (in_stack_00000018 != (MACROBLOCKD *)0x0) {
        sync_write((AV1LfSync *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                   in_stack_ffffffffffffff90);
      }
    }
  }
  else if (in_stack_00000008 == 1) {
    for (local_3c = 0; local_3c < *(int *)(in_RSI->seg_iqmatrix[2] + 7); local_3c = local_3c + 0x20)
    {
      if (in_stack_00000018 != (MACROBLOCKD *)0x0) {
        sync_read((AV1LfSync *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        sync_read((AV1LfSync *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
        if (1 < in_stack_00000018->plane[0].pre[0].stride) {
          pthread_mutex_lock((pthread_mutex_t *)in_stack_00000018->plane[0].pre[1].buf);
          iVar1 = in_stack_00000018->plane[0].pre[1].stride;
          pthread_mutex_unlock((pthread_mutex_t *)in_stack_00000018->plane[0].pre[1].buf);
          if ((iVar1 & 1) != 0) {
            return;
          }
        }
      }
      av1_setup_dst_planes
                (in_RSI,(BLOCK_SIZE)((ulong)in_RDX >> 0x38),in_RCX,in_R8D,in_R9D,plane_start,
                 in_stack_00000010);
      if (in_stack_00000010 == 0) {
        av1_filter_block_plane_horz
                  (in_stack_00000020,in_stack_00000018,in_stack_00000014,
                   (MACROBLOCKD_PLANE *)CONCAT44(in_stack_0000000c,1),unaff_retaddr_00,unaff_retaddr
                  );
      }
      else if (in_R9D == 0) {
        av1_filter_block_plane_horz_opt
                  ((AV1_COMMON *)tx_buf,(MACROBLOCKD *)params_buf,(MACROBLOCKD_PLANE *)error_info,
                   lf_sync._4_4_,(uint32_t)lf_sync,
                   (AV1_DEBLOCKING_PARAMETERS *)CONCAT44(in_stack_0000008c,lpf_opt_level),
                   in_stack_00000360,in_stack_00000368);
      }
      else {
        in_stack_ffffffffffffff98 = (uint)local_4a;
        in_stack_ffffffffffffffa0 = c;
        av1_filter_block_plane_horz_opt_chroma
                  (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
                   in_stack_000000d0,in_stack_000000c8,in_stack_000003f0,in_stack_000003f8,
                   in_stack_000000c7,in_stack_00000408);
      }
    }
  }
  return;
}

Assistant:

void av1_thread_loop_filter_rows(
    const YV12_BUFFER_CONFIG *const frame_buffer, AV1_COMMON *const cm,
    struct macroblockd_plane *planes, MACROBLOCKD *xd, int mi_row, int plane,
    int dir, int lpf_opt_level, AV1LfSync *const lf_sync,
    struct aom_internal_error_info *error_info,
    AV1_DEBLOCKING_PARAMETERS *params_buf, TX_SIZE *tx_buf,
    int num_mis_in_lpf_unit_height_log2) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const int sb_cols =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, MAX_MIB_SIZE_LOG2);
  const int r = mi_row >> num_mis_in_lpf_unit_height_log2;
  int mi_col, c;

  const bool joint_filter_chroma = (lpf_opt_level == 2) && plane > AOM_PLANE_Y;
  const int num_planes = joint_filter_chroma ? 2 : 1;
  assert(IMPLIES(joint_filter_chroma, plane == AOM_PLANE_U));

  if (dir == 0) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_vert_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_vert_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_vert(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
      if (lf_sync != NULL) {
        sync_write(lf_sync, r, c, sb_cols, plane);
      }
    }
  } else if (dir == 1) {
    for (mi_col = 0; mi_col < cm->mi_params.mi_cols; mi_col += MAX_MIB_SIZE) {
      c = mi_col >> MAX_MIB_SIZE_LOG2;

      if (lf_sync != NULL) {
        // Wait for vertical edge filtering of the top-right block to be
        // completed
        sync_read(lf_sync, r, c, plane);

        // Wait for vertical edge filtering of the right block to be completed
        sync_read(lf_sync, r + 1, c, plane);
      }

#if CONFIG_MULTITHREAD
      if (lf_sync && lf_sync->num_workers > 1) {
        pthread_mutex_lock(lf_sync->job_mutex);
        const bool lf_mt_exit = lf_sync->lf_mt_exit;
        pthread_mutex_unlock(lf_sync->job_mutex);
        // Exit in case any worker has encountered an error.
        if (lf_mt_exit) return;
      }
#endif

      av1_setup_dst_planes(planes, cm->seq_params->sb_size, frame_buffer,
                           mi_row, mi_col, plane, plane + num_planes);
      if (lpf_opt_level) {
        if (plane == AOM_PLANE_Y) {
          av1_filter_block_plane_horz_opt(cm, xd, &planes[plane], mi_row,
                                          mi_col, params_buf, tx_buf,
                                          num_mis_in_lpf_unit_height_log2);
        } else {
          av1_filter_block_plane_horz_opt_chroma(
              cm, xd, &planes[plane], mi_row, mi_col, params_buf, tx_buf, plane,
              joint_filter_chroma, num_mis_in_lpf_unit_height_log2);
        }
      } else {
        av1_filter_block_plane_horz(cm, xd, plane, &planes[plane], mi_row,
                                    mi_col);
      }
    }
  }
}